

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckingVisitor.cpp
# Opt level: O0

void __thiscall
TypeCheckingVisitor::Visit(TypeCheckingVisitor *this,ArrayAccessExpression *expression)

{
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  runtime_error *this_00;
  NewScopeLayer *pNVar4;
  mapped_type *pmVar5;
  string local_e0;
  Symbol local_c0;
  string local_a0;
  Symbol local_80;
  NewScopeLayer *local_60;
  NewScopeLayer *layer;
  allocator<char> local_41;
  key_type local_40;
  int local_1c;
  ArrayAccessExpression *pAStack_18;
  int type_code;
  ArrayAccessExpression *expression_local;
  TypeCheckingVisitor *this_local;
  
  pAStack_18 = expression;
  expression_local = (ArrayAccessExpression *)this;
  iVar2 = TemplateVisitor<int>::Accept
                    ((TemplateVisitor<int> *)this,&expression->index_expression_->super_Node);
  local_1c = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"int",&local_41);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->type_system_,&local_40);
  iVar1 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (iVar2 != iVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Non-int type expression in index");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pNVar4 = this->current_layer_;
  std::__cxx11::string::string((string *)&local_a0,(string *)&pAStack_18->array_indent_);
  Symbol::Symbol(&local_80,&local_a0);
  pNVar4 = NewScopeLayer::GetArrayLayer(pNVar4,&local_80);
  Symbol::~Symbol(&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  local_60 = pNVar4;
  std::__cxx11::string::string((string *)&local_e0,(string *)&pAStack_18->array_indent_);
  Symbol::Symbol(&local_c0,&local_e0);
  pmVar5 = std::
           unordered_map<Symbol,_int,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_int>_>_>
           ::operator[](&pNVar4->symbol_types_,&local_c0);
  (this->super_TemplateVisitor<int>).tos_value_ = *pmVar5 + -1;
  Symbol::~Symbol(&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  return;
}

Assistant:

void TypeCheckingVisitor::Visit(ArrayAccessExpression* expression) {
  int type_code = Accept(expression->index_expression_);
  if (type_code != type_system_["int"]) {
    throw std::runtime_error("Non-int type expression in index");
  }

  NewScopeLayer* layer =
      current_layer_->GetArrayLayer(Symbol(expression->array_indent_));

  // -1 to get element type
  tos_value_ = layer->symbol_types_[Symbol(expression->array_indent_)] - 1;
}